

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

Name wasm::Names::getValidDataSegmentName(Module *module,Name root)

{
  IString IVar1;
  size_type sVar2;
  string *in_R9;
  Name NVar3;
  allocator<char> local_91;
  string local_90 [32];
  anon_class_8_1_616f97aa local_70;
  function<bool_(wasm::Name)> local_68;
  Module *local_48;
  char *pcStack_40;
  Module *local_30;
  Module *module_local;
  Name root_local;
  
  pcStack_40 = root.super_IString.str._M_str;
  local_48 = root.super_IString.str._M_len;
  local_70.module = module;
  local_30 = module;
  module_local = local_48;
  root_local.super_IString.str._M_len = (size_t)pcStack_40;
  std::function<bool(wasm::Name)>::
  function<wasm::Names::getValidDataSegmentName(wasm::Module&,wasm::Name)::_lambda(wasm::Name)_1_,void>
            ((function<bool(wasm::Name)> *)&local_68,&local_70);
  sVar2 = std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::size(&local_30->dataSegments);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"_",&local_91);
  NVar3.super_IString.str._M_str = (char *)&local_68;
  NVar3.super_IString.str._M_len = (size_t)pcStack_40;
  NVar3 = getValidName((Names *)local_48,NVar3,(function<bool_(wasm::Name)> *)(sVar2 & 0xffffffff),
                       (Index)local_90,in_R9);
  root_local.super_IString.str._M_str = NVar3.super_IString.str._M_len;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::function<bool_(wasm::Name)>::~function(&local_68);
  IVar1.str._M_str = NVar3.super_IString.str._M_str;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidDataSegmentName(Module& module, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !module.getDataSegmentOrNull(test); },
    module.dataSegments.size());
}